

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

Vec_Int_t * Gia_ManFindLatest(Gia_Man_t *p,int LevelMax,int nTimeWindow)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p_00;
  void *__ptr;
  Gia_Obj_t *pGVar9;
  long lVar10;
  int nCapMin;
  long lVar11;
  uint local_40;
  
  p_00 = Vec_IntAlloc((int)p);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    uVar7 = Gia_ManLevelNum(p);
    if (nTimeWindow != 0) {
      LevelMax = (int)((double)(int)uVar7 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar7 < LevelMax) {
      printf("The maximum AIG level (%d) is less than the target level (%d).\n",(ulong)uVar7,
             (ulong)(uint)LevelMax);
    }
    for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
      pGVar9 = Gia_ManCo(p,iVar4);
      if (pGVar9 == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      iVar8 = Gia_ObjId(p,pGVar9);
      pVVar2 = p->vLevels;
      iVar6 = pVVar2->nSize;
      if (iVar6 <= iVar8) {
        iVar1 = iVar8 + 1;
        iVar3 = pVVar2->nCap * 2;
        nCapMin = iVar1;
        if ((iVar3 <= iVar8) || (nCapMin = iVar3, pVVar2->nCap <= iVar8)) {
          Vec_IntGrow(pVVar2,nCapMin);
          iVar6 = pVVar2->nSize;
        }
        for (lVar11 = (long)iVar6; lVar11 < iVar1; lVar11 = lVar11 + 1) {
          pVVar2->pArray[lVar11] = 0;
        }
        pVVar2->nSize = iVar1;
      }
      iVar6 = Vec_IntEntry(pVVar2,iVar8);
      if (LevelMax <= iVar6) {
        Vec_IntPush(p_00,iVar4);
      }
    }
  }
  else {
    iVar4 = p->nObjs;
    __ptr = calloc((long)iVar4,4);
    uVar7 = 0;
    for (lVar11 = 1; iVar6 = (int)lVar11, lVar11 < iVar4; lVar11 = lVar11 + 1) {
      iVar4 = Vec_IntEntry(p->vMapping,iVar6);
      if (iVar4 != 0) {
        lVar10 = 0;
        while( true ) {
          pVVar2 = p->vMapping;
          iVar4 = Vec_IntEntry(pVVar2,iVar6);
          iVar4 = Vec_IntEntry(pVVar2,iVar4);
          if (iVar4 <= lVar10) break;
          pVVar2 = p->vMapping;
          uVar5 = Vec_IntEntry(pVVar2,iVar6);
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          iVar4 = *(int *)((long)__ptr + lVar11 * 4);
          iVar8 = *(int *)((long)__ptr + (long)pVVar2->pArray[(ulong)uVar5 + lVar10 + 1] * 4);
          if (iVar8 < iVar4) {
            iVar8 = iVar4;
          }
          *(int *)((long)__ptr + lVar11 * 4) = iVar8;
          lVar10 = lVar10 + 1;
        }
        uVar5 = *(int *)((long)__ptr + lVar11 * 4) + 1;
        *(uint *)((long)__ptr + lVar11 * 4) = uVar5;
        if ((int)uVar7 <= (int)uVar5) {
          uVar7 = uVar5;
        }
      }
      iVar4 = p->nObjs;
    }
    local_40 = LevelMax;
    if (nTimeWindow != 0) {
      local_40 = (uint)((double)(int)uVar7 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar7 < (int)local_40) {
      printf("The maximum mapped level (%d) is less than the target level (%d).\n",(ulong)uVar7,
             (ulong)local_40);
    }
    iVar4 = 0;
    while ((iVar4 < p->vCos->nSize && (pGVar9 = Gia_ManCo(p,iVar4), pGVar9 != (Gia_Obj_t *)0x0))) {
      iVar6 = Gia_ObjFaninId0p(p,pGVar9);
      if ((int)local_40 <= *(int *)((long)__ptr + (long)iVar6 * 4)) {
        Vec_IntPush(p_00,iVar4);
      }
      iVar4 = iVar4 + 1;
    }
    free(__ptr);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManFindLatest( Gia_Man_t * p, int LevelMax, int nTimeWindow )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    vOuts = Vec_IntAlloc( 1000 );
    if ( Gia_ManHasMapping(p) )
    {
        int i, k, iFan, nLevels = 0;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            Gia_LutForEachFanin( p, i, iFan, k )
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
            pLevels[i]++;
            nLevels = Abc_MaxInt( nLevels, pLevels[i] );
        }
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum mapped level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( pLevels[Gia_ObjFaninId0p(p, pObj)] >= LevelMax )
                Vec_IntPush( vOuts, i );
        ABC_FREE( pLevels );
    }
    else
    {
        int i, nLevels = Gia_ManLevelNum( p );
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum AIG level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjLevel(p, pObj) >= LevelMax )
                Vec_IntPush( vOuts, i );
    }
    return vOuts;
}